

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_main.cpp
# Opt level: O0

void Cmd_texture_browse(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  char *pcVar2;
  FTextureID local_24;
  int local_20;
  int local_1c;
  int index;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  local_1c = key;
  _index = who;
  who_local = (APlayerPawn *)argv;
  iVar1 = FCommandLine::argc(argv);
  if (iVar1 < 2) {
    Printf("Usage: texture_browse <name>\n");
  }
  else {
    pcVar2 = FCommandLine::operator[]((FCommandLine *)who_local,1);
    local_24 = FTextureManager::CheckForTexture(&TexMan,pcVar2,0,1);
    local_20 = FTextureID::GetIndex(&local_24);
    if (local_20 == -1) {
      pcVar2 = FCommandLine::operator[]((FCommandLine *)who_local,1);
      Printf("Texture %s not found\n",pcVar2);
    }
    FIntCVar::operator=(&texture_browse_index,local_20);
  }
  return;
}

Assistant:

CCMD(texture_browse)
{
	if (argv.argc() > 1)
	{
		const int index = TexMan.CheckForTexture(argv[1], FTexture::TEX_Any).GetIndex();

		if (-1 == index)
		{
			Printf("Texture %s not found\n", argv[1]);
		}

		texture_browse_index = index;
	}
	else
	{
		Printf("Usage: texture_browse <name>\n");
	}
}